

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,void *src,size_t srcSize)

{
  U32 minMatch_00;
  ZSTD_strategy strat;
  BYTE *pBVar1;
  ZSTD_dictMode_e dictMode;
  ZSTD_blockCompressor p_Var2;
  ulong uVar3;
  size_t sVar4;
  BYTE *dst;
  BYTE *ip_00;
  rawSeq rVar5;
  size_t newLitLength;
  int i;
  uint local_110;
  U32 local_104;
  uint uStack_100;
  rawSeq sequence;
  size_t lastLLSize;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  ZSTD_blockCompressor blockCompressor;
  uint minMatch;
  ZSTD_compressionParameters *cParams;
  void *src_local;
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  rawSeqStore_t *rawSeqStore_local;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  minMatch_00 = (ms->cParams).minMatch;
  strat = (ms->cParams).strategy;
  dictMode = ZSTD_matchState_dictMode(ms);
  p_Var2 = ZSTD_selectBlockCompressor(strat,useRowMatchFinder,dictMode);
  uVar3 = (long)src + srcSize;
  lastLLSize = (size_t)src;
  if ((ms->cParams).strategy < ZSTD_btopt) {
    for (; rawSeqStore->pos < rawSeqStore->size && lastLLSize < uVar3;
        lastLLSize = lastLLSize + uStack_100 + (ulong)local_110) {
      ip._0_4_ = (int)uVar3;
      rVar5 = maybeSplitSequence(rawSeqStore,(int)ip - (int)lastLLSize,minMatch_00);
      local_110 = rVar5.matchLength;
      local_104 = rVar5.offset;
      if (local_104 == 0) break;
      ZSTD_ldm_limitTableUpdate(ms,(BYTE *)lastLLSize);
      ZSTD_ldm_fillFastTables(ms,(void *)lastLLSize);
      uStack_100 = rVar5.litLength;
      sVar4 = (*p_Var2)(ms,seqStore,rep,(void *)lastLLSize,rVar5._4_8_);
      for (newLitLength._4_4_ = 2; 0 < newLitLength._4_4_;
          newLitLength._4_4_ = newLitLength._4_4_ + -1) {
        rep[newLitLength._4_4_] = rep[newLitLength._4_4_ + -1];
      }
      *rep = local_104;
      ip_00 = (BYTE *)((lastLLSize + uStack_100) - sVar4);
      if ((BYTE *)(uVar3 - 0x20) < ip_00 + sVar4) {
        ZSTD_safecopyLiterals(seqStore->lit,ip_00,ip_00 + sVar4,(BYTE *)(uVar3 - 0x20));
      }
      else {
        ZSTD_copy16(seqStore->lit,ip_00);
        if (0x10 < sVar4) {
          pBVar1 = seqStore->lit;
          dst = pBVar1 + 0x10;
          ZSTD_copy16(dst,ip_00 + 0x10);
          if (0x10 < (long)(sVar4 - 0x10)) {
            oend = pBVar1 + 0x20;
            do {
              op = ip_00 + 0x20;
              ZSTD_copy16(oend,op);
              ZSTD_copy16(oend + 0x10,ip_00 + 0x30);
              oend = oend + 0x20;
              ip_00 = op;
            } while (oend < dst + (sVar4 - 0x10));
          }
        }
      }
      seqStore->lit = seqStore->lit + sVar4;
      if (0xffff < sVar4) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->litLength = (U16)sVar4;
      seqStore->sequences->offset = local_104 + 3;
      if (0xffff < local_110 - 3) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->matchLength = (U16)(local_110 - 3);
      seqStore->sequences = seqStore->sequences + 1;
    }
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)lastLLSize);
    ZSTD_ldm_fillFastTables(ms,(void *)lastLLSize);
    rawSeqStore_local =
         (rawSeqStore_t *)(*p_Var2)(ms,seqStore,rep,(void *)lastLLSize,uVar3 - lastLLSize);
  }
  else {
    ms->ldmSeqStore = rawSeqStore;
    rawSeqStore_local = (rawSeqStore_t *)(*p_Var2)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
  }
  return (size_t)rawSeqStore_local;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}